

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

char * sznet::sz_strerror_tl(int savedErrno)

{
  long lVar1;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  strerror_r(savedErrno,(char *)(lVar1 + -0x230),0x200);
  return (char *)(lVar1 + -0x230);
}

Assistant:

const char* sz_strerror_tl(int savedErrno)
{
#if defined(SZ_OS_WINDOWS)
	// strerror_s(t_errnobuf, sizeof(t_errnobuf), savedErrno);
	auto chars = FormatMessage(
		FORMAT_MESSAGE_FROM_SYSTEM |
		FORMAT_MESSAGE_IGNORE_INSERTS,
		nullptr,
		savedErrno,
		MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
		(LPTSTR)t_errnobuf,
		sizeof(t_errnobuf) - 1,
		nullptr);
	if (chars != 0)
	{
		if (chars >= 2 && t_errnobuf[chars - 2] == '\r' && t_errnobuf[chars - 1] == '\n')
		{
			chars -= 2;
			t_errnobuf[chars] = 0;
		}
	}
#else
	strerror_r(savedErrno, t_errnobuf, sizeof(t_errnobuf));
#endif
	return t_errnobuf;
}